

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O2

DomainSet * __thiscall
MatryoshkaDAG::extractDomains
          (DomainSet *__return_storage_ptr__,MatryoshkaDAG *this,size_t i,float areaCovered)

{
  size_t sVar1;
  reference pdVar2;
  size_t l;
  float fVar3;
  float fVar4;
  double dVar5;
  Domain local_48;
  
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  l = this->params->n;
  if ((areaCovered != -1.0) || (NAN(areaCovered))) {
    do {
      sVar1 = *(size_t *)
               (*(long *)&(this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[l].
                          super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                          ._M_impl.super__Vector_impl_data + 8 + i * 0x18);
      dVar5 = q(this,sVar1,l);
      if (0.0 < dVar5) {
        fVar3 = log10f(areaCovered / (float)(l - sVar1));
        pdVar2 = boost::numeric::ublas::
                 symmetric_matrix<double,_boost::numeric::ublas::basic_upper<unsigned_long>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(&this->params->sums,sVar1 - 1,l - 1);
        fVar4 = log10f((float)*pdVar2);
        Domain::Domain(&local_48,sVar1 - 1,l - 1,fVar4 * fVar3);
        std::vector<Domain,_std::allocator<Domain>_>::emplace_back<Domain>
                  (__return_storage_ptr__,&local_48);
      }
      l = sVar1 - 1;
    } while (1 < l);
  }
  else {
    do {
      sVar1 = *(size_t *)
               (*(long *)&(this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[l].
                          super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                          ._M_impl.super__Vector_impl_data + 8 + i * 0x18);
      dVar5 = q(this,sVar1,l);
      if (0.0 < dVar5) {
        Domain::Domain(&local_48,sVar1 - 1,l - 1);
        std::vector<Domain,_std::allocator<Domain>_>::emplace_back<Domain>
                  (__return_storage_ptr__,&local_48);
      }
      l = sVar1 - 1;
    } while (1 < l);
  }
  return __return_storage_ptr__;
}

Assistant:

DomainSet MatryoshkaDAG::extractDomains(size_t i, float areaCovered) {
    size_t k,l;
    DomainSet dset;

    float ratio, weight;

    l = params->n;
    if (areaCovered == -1) {    
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                dset.push_back(Domain(k-1,l-1)); 
            }
            l = k-1;
        } while(l > 1);
    }
    else {
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                ratio = log10(areaCovered/float(l-k));
                weight = log10(float(params->sums(k-1, l-1))) * ratio;
                dset.push_back(Domain(k-1, l-1, weight)); 
            }
            l = k-1;
        } while(l > 1);
    }
    
    return dset;
}